

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void __thiscall
ot::commissioner::UdpSocket::SetEventHandler(UdpSocket *this,EventHandler *aEventHandler)

{
  anon_class_40_2_31672e3e local_40;
  EventHandler *local_18;
  EventHandler *aEventHandler_local;
  UdpSocket *this_local;
  
  local_40.this = this;
  local_18 = aEventHandler;
  aEventHandler_local = (EventHandler *)this;
  std::function<void_(short)>::function(&local_40.aEventHandler,aEventHandler);
  std::function<void(short)>::operator=
            ((function<void(short)> *)&(this->super_Socket).mEventHandler,&local_40);
  SetEventHandler(std::function<void(short)>)::$_0::~__0((__0 *)&local_40);
  return;
}

Assistant:

void UdpSocket::SetEventHandler(EventHandler aEventHandler)
{
    mEventHandler = [this, aEventHandler](short aFlags) {
        if (mIsBound && !mIsConnected && (aFlags & EV_READ))
        {
            mbedtls_net_context connectedCtx;
            mbedtls_net_init(&connectedCtx);

            // This will get 'mNetCtx' connected and returned as 'connectCtx'.
            int rval = mbedtls_net_accept(&mNetCtx, &connectedCtx, nullptr, 0, nullptr);
            if (rval != 0)
            {
                LOG_INFO(LOG_REGION_SOCKET, "UDP socket(={}) accept new connection failed: {}",
                         static_cast<void *>(this), rval);
            }
            else
            {
                mbedtls_net_free(&mNetCtx);

                // We know that 'connectedCtx' has the same fd as the original 'mNetCtx' before accept.
                mNetCtx      = connectedCtx;
                mIsConnected = true;
            }
        }

        // Do not handle event unless the socket is connected.
        if (mIsConnected)
        {
            aEventHandler(aFlags);
        }
    };
}